

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

void qpdf_set_logger(qpdf_data qpdf,qpdflogger_handle logger)

{
  QPDF *this;
  __shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  this = (qpdf->qpdf).super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_20,(__shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2> *)logger);
  QPDF::setLogger(this,(shared_ptr<QPDFLogger> *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return;
}

Assistant:

void
qpdf_set_logger(qpdf_data qpdf, qpdflogger_handle logger)
{
    qpdf->qpdf->setLogger(logger->l);
}